

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jit.c
# Opt level: O2

int ravi_compile_n(lua_State *L)

{
  byte bVar1;
  int iVar2;
  void *pvVar3;
  byte bVar4;
  lua_Integer *in_RCX;
  int n;
  lua_Integer in_R8;
  ravi_compile_options_t local_358;
  lua_Integer ival;
  Proto *functions [100];
  
  iVar2 = lua_type(L,1);
  if (iVar2 == 5) {
    lua_pushnil(L);
    n = 0;
    while( true ) {
      iVar2 = lua_next(L,1);
      if (iVar2 == 0) break;
      if (n < 100) {
        iVar2 = lua_type(L,-1);
        if (iVar2 == 6) {
          iVar2 = lua_iscfunction(L,-1);
          if (iVar2 == 0) {
            pvVar3 = lua_topointer(L,-1);
            if (((*(Proto **)((long)pvVar3 + 0x18))->ravi_jit).jit_function == (lua_CFunction)0x0) {
              in_RCX = (lua_Integer *)(long)n;
              n = n + 1;
              functions[(long)in_RCX] = *(Proto **)((long)pvVar3 + 0x18);
            }
          }
        }
      }
      lua_settop(L,-2);
    }
    goto LAB_00132f13;
  }
  n = 1;
  iVar2 = lua_type(L,1);
  if (iVar2 == 6) {
    iVar2 = lua_iscfunction(L,1);
    if (iVar2 != 0) goto LAB_00132eee;
  }
  else {
LAB_00132eee:
    luaL_argerror(L,1,"argument must be a Lua function");
  }
  pvVar3 = lua_topointer(L,1);
  functions[0] = *(Proto **)((long)pvVar3 + 0x18);
LAB_00132f13:
  local_358 = (ravi_compile_options_t)0x7;
  iVar2 = lua_type(L,2);
  if (iVar2 == 5) {
    l_table_get_integer(L,0x155082,(char *)&ival,in_RCX,in_R8);
    bVar1 = ((int)ival != 0) * '\x02';
    l_table_get_integer(L,0x155099,(char *)&ival,in_RCX,in_R8);
    bVar4 = bVar1 | 1;
    if ((int)ival != 0) {
      bVar4 = bVar1 | 5;
    }
    local_358._0_1_ = bVar4;
  }
  if (n < 1) {
    iVar2 = 0;
  }
  else {
    iVar2 = raviV_compile_n(L,functions,n,&local_358);
  }
  lua_pushboolean(L,iVar2);
  return 1;
}

Assistant:

static int ravi_compile_n(lua_State *L) {
  enum { MAX_COMPILES = 100 };
  Proto *functions[MAX_COMPILES];
  int n = 0;
  if (lua_istable(L, 1)) {
    lua_pushnil(L);  // push first key
    while (lua_next(L, 1)) {
      if (n < MAX_COMPILES && lua_isfunction(L, -1) &&
          !lua_iscfunction(L, -1)) {
        void *p = (void *)lua_topointer(L, -1);
        LClosure *l = (LClosure *)(p);
        if (!l->p->ravi_jit.jit_function) functions[n++] = l->p;
      }
      lua_pop(L, 1);  // pop value, but keep key
    }
  }
  else {
    luaL_argcheck(L, lua_isfunction(L, 1) && !lua_iscfunction(L, 1), 1,
                  "argument must be a Lua function");
    void *p = (void *)lua_topointer(L, 1);
    LClosure *l = (LClosure *)(p);
    functions[n++] = l->p;
  }
  ravi_compile_options_t options = {0, 0, 0, RAVI_CODEGEN_NONE};
  options.manual_request = 1;
  options.inline_lua_arithmetic_operators = 1;
  options.omit_array_get_range_check = 1;
  if (lua_istable(L, 2)) {
    lua_Integer ival;
    l_table_get_integer(L, 2, "omitArrayGetRangeCheck",
                        &ival, 0);
    options.omit_array_get_range_check = (int)ival ? 1 : 0;
    l_table_get_integer(L, 2, "inlineLuaArithmeticOperators",
                        &ival, 0);
    options.inline_lua_arithmetic_operators = (int)ival ? 1 : 0;
  }
  int result = 0;
  if (n > 0) { result = raviV_compile_n(L, functions, n, &options); }
  lua_pushboolean(L, result);
  return 1;
}